

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int x509V3_add_len_value
              (char *name,char *value,size_t value_len,int omit_value,stack_st_CONF_VALUE **extlist)

{
  stack_st_CONF_VALUE *psVar1;
  char *orig_ptr;
  CONF_VALUE *p;
  OPENSSL_STACK *pOVar2;
  size_t sVar3;
  void *pvVar4;
  char *orig_ptr_00;
  
  psVar1 = *extlist;
  if (name == (char *)0x0) {
    orig_ptr = (char *)0x0;
LAB_001a8aff:
    if (omit_value != 0) {
      orig_ptr_00 = (char *)0x0;
LAB_001a8b06:
      p = CONF_VALUE_new();
      if (p == (CONF_VALUE *)0x0) {
        p = (CONF_VALUE *)0x0;
      }
      else {
        if (*extlist == (stack_st_CONF_VALUE *)0x0) {
          pOVar2 = OPENSSL_sk_new_null();
          *extlist = (stack_st_CONF_VALUE *)pOVar2;
          if (pOVar2 == (OPENSSL_STACK *)0x0) goto LAB_001a8bba;
        }
        p->section = (char *)0x0;
        p->name = orig_ptr;
        p->value = orig_ptr_00;
        sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)*extlist,p);
        if (sVar3 != 0) {
          return 1;
        }
      }
      goto LAB_001a8bba;
    }
    if ((value_len == 0) || (pvVar4 = memchr(value,0,value_len), pvVar4 == (void *)0x0)) {
      orig_ptr_00 = OPENSSL_strndup(value,value_len);
      if (orig_ptr_00 != (char *)0x0) goto LAB_001a8b06;
    }
    else {
      ERR_put_error(0x14,0,0xa3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                    ,0x3d);
    }
  }
  else {
    orig_ptr = OPENSSL_strdup(name);
    if (orig_ptr != (char *)0x0) goto LAB_001a8aff;
    orig_ptr = (char *)0x0;
  }
  p = (CONF_VALUE *)0x0;
  orig_ptr_00 = (char *)0x0;
LAB_001a8bba:
  if (psVar1 == (stack_st_CONF_VALUE *)0x0) {
    OPENSSL_sk_free((OPENSSL_STACK *)*extlist);
    *extlist = (stack_st_CONF_VALUE *)0x0;
  }
  OPENSSL_free(p);
  OPENSSL_free(orig_ptr);
  OPENSSL_free(orig_ptr_00);
  return 0;
}

Assistant:

static int x509V3_add_len_value(const char *name, const char *value,
                                size_t value_len, int omit_value,
                                STACK_OF(CONF_VALUE) **extlist) {
  CONF_VALUE *vtmp = NULL;
  char *tname = NULL, *tvalue = NULL;
  int extlist_was_null = *extlist == NULL;
  if (name && !(tname = OPENSSL_strdup(name))) {
    goto err;
  }
  if (!omit_value) {
    // |CONF_VALUE| cannot represent strings with NULs.
    if (OPENSSL_memchr(value, 0, value_len)) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_VALUE);
      goto err;
    }
    tvalue = OPENSSL_strndup(value, value_len);
    if (tvalue == NULL) {
      goto err;
    }
  }
  if (!(vtmp = CONF_VALUE_new())) {
    goto err;
  }
  if (!*extlist && !(*extlist = sk_CONF_VALUE_new_null())) {
    goto err;
  }
  vtmp->section = NULL;
  vtmp->name = tname;
  vtmp->value = tvalue;
  if (!sk_CONF_VALUE_push(*extlist, vtmp)) {
    goto err;
  }
  return 1;
err:
  if (extlist_was_null) {
    sk_CONF_VALUE_free(*extlist);
    *extlist = NULL;
  }
  OPENSSL_free(vtmp);
  OPENSSL_free(tname);
  OPENSSL_free(tvalue);
  return 0;
}